

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

void duckdb::GetBitStringAggregate(LogicalType *type,AggregateFunctionSet *bitstring_agg)

{
  LogicalTypeId LVar1;
  InternalException *this;
  uint uVar2;
  LogicalType *return_type;
  LogicalType *pLVar3;
  vector<duckdb::AggregateFunction,_true> *pvVar4;
  long lVar5;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  initializer_list<duckdb::LogicalType> __l_08;
  allocator_type local_3f9;
  LogicalType local_3f8;
  undefined1 local_3e0 [48];
  undefined1 local_3b0 [48];
  LogicalType local_380 [10];
  AggregateFunction function;
  AggregateFunction local_150;
  
  LVar1 = type->id_;
  uVar2 = LVar1 - 0xb;
  if (uVar2 < 4) {
    pLVar3 = (LogicalType *)
             ((long)&switchD_01b017b9::switchdataD_02043cc4 +
             (long)(int)(&switchD_01b017b9::switchdataD_02043cc4)[uVar2]);
    switch((uint)LVar1) {
    case 0xb:
      LogicalType::LogicalType((LogicalType *)local_3e0,TINYINT);
      LogicalType::LogicalType(&local_3f8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<signed_char>,signed_char,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                (&function,(AggregateFunction *)local_3e0,&local_3f8,pLVar3);
      LogicalType::~LogicalType(&local_3f8);
      LogicalType::~LogicalType((LogicalType *)local_3e0);
      function.bind = BindBitstringAgg;
      function.serialize = BitstringAggBindData::Serialize;
      function.deserialize = BitstringAggBindData::Deserialize;
      function.statistics = BitstringPropagateStats;
      AggregateFunction::AggregateFunction(&local_150,&function);
      pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_150);
      AggregateFunction::~AggregateFunction(&local_150);
      LogicalType::LogicalType((LogicalType *)local_3b0,TINYINT);
      LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),TINYINT);
      LogicalType::LogicalType(local_380,TINYINT);
      __l_00._M_len = 3;
      __l_00._M_array = (iterator)local_3b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18),__l_00,&local_3f9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      lVar5 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      function.statistics = (aggregate_statistics_t)0x0;
      AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_3b0);
      break;
    case 0xc:
      LogicalType::LogicalType((LogicalType *)local_3e0,SMALLINT);
      LogicalType::LogicalType(&local_3f8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<short>,short,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                (&function,(AggregateFunction *)local_3e0,&local_3f8,pLVar3);
      LogicalType::~LogicalType(&local_3f8);
      LogicalType::~LogicalType((LogicalType *)local_3e0);
      function.bind = BindBitstringAgg;
      function.serialize = BitstringAggBindData::Serialize;
      function.deserialize = BitstringAggBindData::Deserialize;
      function.statistics = BitstringPropagateStats;
      AggregateFunction::AggregateFunction(&local_150,&function);
      pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_150);
      AggregateFunction::~AggregateFunction(&local_150);
      LogicalType::LogicalType((LogicalType *)local_3b0,SMALLINT);
      LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),SMALLINT);
      LogicalType::LogicalType(local_380,SMALLINT);
      __l_08._M_len = 3;
      __l_08._M_array = (iterator)local_3b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18),__l_08,&local_3f9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      lVar5 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      function.statistics = (aggregate_statistics_t)0x0;
      AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_3b0);
      break;
    case 0xd:
      LogicalType::LogicalType((LogicalType *)local_3e0,INTEGER);
      LogicalType::LogicalType(&local_3f8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<int>,int,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                (&function,(AggregateFunction *)local_3e0,&local_3f8,pLVar3);
      LogicalType::~LogicalType(&local_3f8);
      LogicalType::~LogicalType((LogicalType *)local_3e0);
      function.bind = BindBitstringAgg;
      function.serialize = BitstringAggBindData::Serialize;
      function.deserialize = BitstringAggBindData::Deserialize;
      function.statistics = BitstringPropagateStats;
      AggregateFunction::AggregateFunction(&local_150,&function);
      pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_150);
      AggregateFunction::~AggregateFunction(&local_150);
      LogicalType::LogicalType((LogicalType *)local_3b0,INTEGER);
      LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),INTEGER);
      LogicalType::LogicalType(local_380,INTEGER);
      __l_04._M_len = 3;
      __l_04._M_array = (iterator)local_3b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18),__l_04,&local_3f9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      lVar5 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      function.statistics = (aggregate_statistics_t)0x0;
      AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_3b0);
      break;
    case 0xe:
      LogicalType::LogicalType((LogicalType *)local_3e0,BIGINT);
      LogicalType::LogicalType(&local_3f8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<long>,long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                (&function,(AggregateFunction *)local_3e0,&local_3f8,pLVar3);
      LogicalType::~LogicalType(&local_3f8);
      LogicalType::~LogicalType((LogicalType *)local_3e0);
      function.bind = BindBitstringAgg;
      function.serialize = BitstringAggBindData::Serialize;
      function.deserialize = BitstringAggBindData::Deserialize;
      function.statistics = BitstringPropagateStats;
      AggregateFunction::AggregateFunction(&local_150,&function);
      pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_150);
      AggregateFunction::~AggregateFunction(&local_150);
      LogicalType::LogicalType((LogicalType *)local_3b0,BIGINT);
      LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),BIGINT);
      LogicalType::LogicalType(local_380,BIGINT);
      __l_07._M_len = 3;
      __l_07._M_array = (iterator)local_3b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18),__l_07,&local_3f9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      lVar5 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      function.statistics = (aggregate_statistics_t)0x0;
      AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_3b0);
    }
  }
  else {
    pLVar3 = (LogicalType *)(ulong)(LVar1 - 0x1c);
    if (LVar1 - 0x1c < 4) {
      return_type = (LogicalType *)
                    ((long)&switchD_01b01648::switchdataD_02043cd4 +
                    (long)(int)(&switchD_01b01648::switchdataD_02043cd4)[(long)pLVar3]);
      switch(pLVar3) {
      case (LogicalType *)0x0:
        LogicalType::LogicalType((LogicalType *)local_3e0,UTINYINT);
        LogicalType::LogicalType(&local_3f8,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_char>,unsigned_char,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  (&function,(AggregateFunction *)local_3e0,&local_3f8,return_type);
        LogicalType::~LogicalType(&local_3f8);
        LogicalType::~LogicalType((LogicalType *)local_3e0);
        function.bind = BindBitstringAgg;
        function.serialize = BitstringAggBindData::Serialize;
        function.deserialize = BitstringAggBindData::Deserialize;
        function.statistics = BitstringPropagateStats;
        AggregateFunction::AggregateFunction(&local_150,&function);
        pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,&local_150);
        AggregateFunction::~AggregateFunction(&local_150);
        LogicalType::LogicalType((LogicalType *)local_3b0,UTINYINT);
        LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),UTINYINT);
        LogicalType::LogicalType(local_380,UTINYINT);
        __l._M_len = 3;
        __l._M_array = (iterator)local_3b0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18),__l,&local_3f9);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                  (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        lVar5 = 0x30;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        function.statistics = (aggregate_statistics_t)0x0;
        AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,(AggregateFunction *)local_3b0);
        break;
      case (LogicalType *)0x1:
        LogicalType::LogicalType((LogicalType *)local_3e0,USMALLINT);
        LogicalType::LogicalType(&local_3f8,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_short>,unsigned_short,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  (&function,(AggregateFunction *)local_3e0,&local_3f8,return_type);
        LogicalType::~LogicalType(&local_3f8);
        LogicalType::~LogicalType((LogicalType *)local_3e0);
        function.bind = BindBitstringAgg;
        function.serialize = BitstringAggBindData::Serialize;
        function.deserialize = BitstringAggBindData::Deserialize;
        function.statistics = BitstringPropagateStats;
        AggregateFunction::AggregateFunction(&local_150,&function);
        pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,&local_150);
        AggregateFunction::~AggregateFunction(&local_150);
        LogicalType::LogicalType((LogicalType *)local_3b0,USMALLINT);
        LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),USMALLINT);
        LogicalType::LogicalType(local_380,USMALLINT);
        __l_05._M_len = 3;
        __l_05._M_array = (iterator)local_3b0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18),__l_05,&local_3f9);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                  (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        lVar5 = 0x30;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        function.statistics = (aggregate_statistics_t)0x0;
        AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,(AggregateFunction *)local_3b0);
        break;
      case (LogicalType *)0x2:
        LogicalType::LogicalType((LogicalType *)local_3e0,UINTEGER);
        LogicalType::LogicalType(&local_3f8,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_int>,unsigned_int,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  (&function,(AggregateFunction *)local_3e0,&local_3f8,return_type);
        LogicalType::~LogicalType(&local_3f8);
        LogicalType::~LogicalType((LogicalType *)local_3e0);
        function.bind = BindBitstringAgg;
        function.serialize = BitstringAggBindData::Serialize;
        function.deserialize = BitstringAggBindData::Deserialize;
        function.statistics = BitstringPropagateStats;
        AggregateFunction::AggregateFunction(&local_150,&function);
        pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,&local_150);
        AggregateFunction::~AggregateFunction(&local_150);
        LogicalType::LogicalType((LogicalType *)local_3b0,UINTEGER);
        LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),UINTEGER);
        LogicalType::LogicalType(local_380,UINTEGER);
        __l_02._M_len = 3;
        __l_02._M_array = (iterator)local_3b0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18),__l_02,&local_3f9);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                  (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        lVar5 = 0x30;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        function.statistics = (aggregate_statistics_t)0x0;
        AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,(AggregateFunction *)local_3b0);
        break;
      case (LogicalType *)0x3:
        LogicalType::LogicalType((LogicalType *)local_3e0,UBIGINT);
        LogicalType::LogicalType(&local_3f8,BIT);
        AggregateFunction::
        UnaryAggregateDestructor<duckdb::BitAggState<unsigned_long>,unsigned_long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                  (&function,(AggregateFunction *)local_3e0,&local_3f8,return_type);
        LogicalType::~LogicalType(&local_3f8);
        LogicalType::~LogicalType((LogicalType *)local_3e0);
        function.bind = BindBitstringAgg;
        function.serialize = BitstringAggBindData::Serialize;
        function.deserialize = BitstringAggBindData::Deserialize;
        function.statistics = BitstringPropagateStats;
        AggregateFunction::AggregateFunction(&local_150,&function);
        pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,&local_150);
        AggregateFunction::~AggregateFunction(&local_150);
        LogicalType::LogicalType((LogicalType *)local_3b0,UBIGINT);
        LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),UBIGINT);
        LogicalType::LogicalType(local_380,UBIGINT);
        __l_03._M_len = 3;
        __l_03._M_array = (iterator)local_3b0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18),__l_03,&local_3f9);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                  (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (local_3e0 + 0x18));
        lVar5 = 0x30;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
          lVar5 = lVar5 + -0x18;
        } while (lVar5 != -0x18);
        function.statistics = (aggregate_statistics_t)0x0;
        AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>
                  (&pvVar4->
                    super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                   ,(AggregateFunction *)local_3b0);
      }
    }
    else if (LVar1 == UHUGEINT) {
      LogicalType::LogicalType((LogicalType *)local_3e0,UHUGEINT);
      LogicalType::LogicalType(&local_3f8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                (&function,(AggregateFunction *)local_3e0,&local_3f8,pLVar3);
      LogicalType::~LogicalType(&local_3f8);
      LogicalType::~LogicalType((LogicalType *)local_3e0);
      function.bind = BindBitstringAgg;
      function.serialize = BitstringAggBindData::Serialize;
      function.deserialize = BitstringAggBindData::Deserialize;
      function.statistics = BitstringPropagateStats;
      AggregateFunction::AggregateFunction(&local_150,&function);
      pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_150);
      AggregateFunction::~AggregateFunction(&local_150);
      LogicalType::LogicalType((LogicalType *)local_3b0,UHUGEINT);
      LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),UHUGEINT);
      LogicalType::LogicalType(local_380,UHUGEINT);
      __l_06._M_len = 3;
      __l_06._M_array = (iterator)local_3b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18),__l_06,&local_3f9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      lVar5 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      function.statistics = (aggregate_statistics_t)0x0;
      AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_3b0);
    }
    else {
      if (LVar1 != HUGEINT) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&function,"Unimplemented bitstring aggregate",(allocator *)&local_150);
        InternalException::InternalException(this,(string *)&function);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LogicalType::LogicalType((LogicalType *)local_3e0,HUGEINT);
      LogicalType::LogicalType(&local_3f8,BIT);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::BitAggState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
                (&function,(AggregateFunction *)local_3e0,&local_3f8,pLVar3);
      LogicalType::~LogicalType(&local_3f8);
      LogicalType::~LogicalType((LogicalType *)local_3e0);
      function.bind = BindBitstringAgg;
      function.serialize = BitstringAggBindData::Serialize;
      function.deserialize = BitstringAggBindData::Deserialize;
      function.statistics = BitstringPropagateStats;
      AggregateFunction::AggregateFunction(&local_150,&function);
      pvVar4 = &(bitstring_agg->super_FunctionSet<duckdb::AggregateFunction>).functions;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_150);
      AggregateFunction::~AggregateFunction(&local_150);
      LogicalType::LogicalType((LogicalType *)local_3b0,HUGEINT);
      LogicalType::LogicalType((LogicalType *)(local_3b0 + 0x18),HUGEINT);
      LogicalType::LogicalType(local_380,HUGEINT);
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)local_3b0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18),__l_01,&local_3f9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                (&function.super_BaseScalarFunction.super_SimpleFunction.arguments.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_3e0 + 0x18));
      lVar5 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_3b0 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      function.statistics = (aggregate_statistics_t)0x0;
      AggregateFunction::AggregateFunction((AggregateFunction *)local_3b0,&function);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&pvVar4->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,(AggregateFunction *)local_3b0);
    }
  }
  AggregateFunction::~AggregateFunction((AggregateFunction *)local_3b0);
  AggregateFunction::~AggregateFunction(&function);
  return;
}

Assistant:

void GetBitStringAggregate(const LogicalType &type, AggregateFunctionSet &bitstring_agg) {
	switch (type.id()) {
	case LogicalType::TINYINT: {
		return BindBitString<int8_t>(bitstring_agg, type.id());
	}
	case LogicalType::SMALLINT: {
		return BindBitString<int16_t>(bitstring_agg, type.id());
	}
	case LogicalType::INTEGER: {
		return BindBitString<int32_t>(bitstring_agg, type.id());
	}
	case LogicalType::BIGINT: {
		return BindBitString<int64_t>(bitstring_agg, type.id());
	}
	case LogicalType::HUGEINT: {
		return BindBitString<hugeint_t>(bitstring_agg, type.id());
	}
	case LogicalType::UTINYINT: {
		return BindBitString<uint8_t>(bitstring_agg, type.id());
	}
	case LogicalType::USMALLINT: {
		return BindBitString<uint16_t>(bitstring_agg, type.id());
	}
	case LogicalType::UINTEGER: {
		return BindBitString<uint32_t>(bitstring_agg, type.id());
	}
	case LogicalType::UBIGINT: {
		return BindBitString<uint64_t>(bitstring_agg, type.id());
	}
	case LogicalType::UHUGEINT: {
		return BindBitString<uhugeint_t>(bitstring_agg, type.id());
	}
	default:
		throw InternalException("Unimplemented bitstring aggregate");
	}
}